

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<int,char_const(&)[3],char_const*,char_const(&)[2]>
                   (string *__return_storage_ptr__,int *a,char (*b) [3],char **args,
                   char (*args_1) [2])

{
  char *__s;
  cmAlphaNum *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  undefined1 local_c0 [56];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  size_t local_70;
  char (*local_68) [3];
  undefined8 local_60;
  size_t local_58;
  char *local_50;
  undefined8 local_48;
  size_t local_40;
  char (*local_38) [2];
  undefined8 local_30;
  
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_c0,*a);
  pcVar1 = (cmAlphaNum *)(local_c0 + 0x10);
  if ((cmAlphaNum *)local_c0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_c0._0_8_;
  }
  local_88.first._M_str = (char *)pcVar1->RValueString_;
  pcVar1 = (cmAlphaNum *)local_c0;
  if ((cmAlphaNum *)local_c0._0_8_ != (cmAlphaNum *)0x0) {
    pcVar1 = (cmAlphaNum *)local_c0._0_8_;
  }
  local_88.first._M_len = (pcVar1->View_)._M_len;
  local_88.second =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0._0_8_;
  local_70 = strlen(*b);
  local_60 = 0;
  __s = *args;
  local_68 = b;
  local_58 = strlen(__s);
  local_48 = 0;
  local_50 = __s;
  local_40 = strlen(*args_1);
  local_30 = 0;
  views._M_len = 4;
  views._M_array = &local_88;
  local_38 = args_1;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}